

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second,
              ExprBase *third)

{
  int iVar1;
  undefined4 extraout_var;
  ArrayView<ExprBase_*> arr;
  SmallArray<ExprBase_*,_3U> local_50;
  
  local_50.allocator = ctx->allocator;
  local_50.data = local_50.little;
  local_50.count = 3;
  local_50.max = 3;
  local_50.little[0] = first;
  local_50.little[1] = second;
  local_50.little[2] = third;
  iVar1 = (*(local_50.allocator)->_vptr_Allocator[2])(local_50.allocator,0x68);
  arr.count = local_50.count;
  arr.data = local_50.data;
  arr._12_4_ = 0;
  ExprSequence::ExprSequence
            ((ExprSequence *)CONCAT44(extraout_var,iVar1),ctx->allocator,source,third->type,arr);
  SmallArray<ExprBase_*,_3U>::~SmallArray(&local_50);
  return &((ExprSequence *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second, ExprBase *third)
{
	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);
	expressions.push_back(third);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, third->type, expressions);
}